

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAuxSourceDirectoryCommand.cxx
# Opt level: O3

bool cmAuxSourceDirectoryCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  long lVar1;
  string *in_name;
  cmMakefile *this;
  size_type sVar2;
  pointer pbVar3;
  pointer pbVar4;
  bool bVar5;
  string *psVar6;
  Status SVar7;
  unsigned_long uVar8;
  char *__s;
  ulong uVar9;
  cmake *pcVar10;
  const_iterator cVar11;
  cmSourceFile *this_00;
  undefined8 uVar12;
  _Alloc_hider _Var13;
  pointer pcVar14;
  unsigned_long dindex;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view value;
  Directory dir;
  string file;
  string sourceListValue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string tdir;
  string fullname;
  Directory local_170;
  string local_168;
  undefined1 *local_148;
  undefined8 local_140;
  size_type local_138;
  pointer local_130;
  undefined8 local_128;
  string local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  size_t local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  string local_c0;
  undefined1 **local_a0;
  undefined8 local_98;
  undefined1 *local_90;
  undefined1 local_88 [32];
  string *local_68;
  long local_60;
  unsigned_long local_58;
  string local_50;
  
  in_name = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_60 = (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)in_name;
  if (local_60 == 0x40) {
    this = status->Makefile;
    local_100 = &local_f0;
    local_f8 = 0;
    local_f0._M_local_buf[0] = '\0';
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_c0._M_string_length = 0;
    local_c0.field_2._M_local_buf[0] = '\0';
    local_e0 = args;
    bVar5 = cmsys::SystemTools::FileIsFullPath(in_name);
    if (bVar5) {
      std::__cxx11::string::_M_assign((string *)&local_c0);
    }
    else {
      psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
      local_168._M_string_length = (size_type)(psVar6->_M_dataplus)._M_p;
      local_168._M_dataplus._M_p = (pointer)psVar6->_M_string_length;
      local_168.field_2._M_allocated_capacity = 0;
      local_148 = local_88;
      local_a0 = (undefined1 **)0x0;
      local_98 = 1;
      local_88[0] = 0x2f;
      local_168.field_2._8_8_ = 1;
      local_140 = 0;
      local_130 = (in_name->_M_dataplus)._M_p;
      local_138 = in_name->_M_string_length;
      local_128 = 0;
      views._M_len = 3;
      views._M_array = (iterator)&local_168;
      local_90 = local_148;
      cmCatViews(&local_120,views);
      std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_120);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._M_dataplus._M_p != &local_120.field_2) {
        operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
      }
    }
    cmMakefile::GetSafeDefinition
              (this,(local_e0->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1);
    std::__cxx11::string::_M_assign((string *)&local_100);
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmsys::Directory::Directory(&local_170);
    local_68 = in_name;
    SVar7 = cmsys::Directory::Load(&local_170,&local_c0,(string *)0x0);
    if ((SVar7.Kind_ == Success) &&
       (uVar8 = cmsys::Directory::GetNumberOfFiles(&local_170), uVar8 != 0)) {
      dindex = 0;
      local_58 = uVar8;
      do {
        __s = cmsys::Directory::GetFile(&local_170,dindex);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,__s,(allocator<char> *)&local_168);
        uVar9 = std::__cxx11::string::rfind((char)&local_120,0x2e);
        sVar2 = local_120._M_string_length;
        if (uVar9 != 0xffffffffffffffff) {
          lVar1 = uVar9 + 1;
          if (local_120._M_string_length <= uVar9) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",lVar1,local_120._M_string_length);
          }
          pcVar14 = local_120._M_dataplus._M_p + lVar1;
          pcVar10 = cmMakefile::GetCMakeInstance(this);
          if (uVar9 != 0) {
            local_168._M_dataplus._M_p = (pointer)(sVar2 - lVar1);
            local_168._M_string_length = (size_type)pcVar14;
            cVar11 = std::
                     _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::find(&(pcVar10->CLikeSourceFileExtensions).unordered._M_h,
                            (key_type *)&local_168);
            if (cVar11.
                super__Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
                ._M_cur != (__node_type *)0x0) {
              local_168._M_string_length = (size_type)(local_68->_M_dataplus)._M_p;
              local_168._M_dataplus._M_p = (pointer)local_68->_M_string_length;
              local_168.field_2._M_allocated_capacity = 0;
              local_a0 = (undefined1 **)0x0;
              local_98 = 1;
              local_148 = local_88;
              local_88[0] = 0x2f;
              local_168.field_2._8_8_ = 1;
              local_140 = 0;
              local_138 = local_120._M_string_length;
              local_130 = local_120._M_dataplus._M_p;
              local_128 = 0;
              views_00._M_len = 3;
              views_00._M_array = (iterator)&local_168;
              local_90 = local_148;
              cmCatViews(&local_50,views_00);
              this_00 = cmMakefile::GetOrCreateSource(this,&local_50,false,Ambiguous);
              local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"ABSTRACT","");
              local_a0 = &local_90;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"0","");
              cmSourceFile::SetProperty(this_00,&local_168,(string *)&local_a0);
              if (local_a0 != &local_90) {
                operator_delete(local_a0,(ulong)(local_90 + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_168._M_dataplus._M_p != &local_168.field_2) {
                operator_delete(local_168._M_dataplus._M_p,
                                local_168.field_2._M_allocated_capacity + 1);
              }
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_d8,&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
        }
        dindex = dindex + 1;
      } while (local_58 != dindex);
    }
    pbVar4 = local_d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = local_d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar9 = (long)local_d8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_d8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar1 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar3,pbVar4);
    }
    if (local_f8 != 0) {
      std::__cxx11::string::append((char *)&local_100);
    }
    cmList::
    to_string<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
              (&local_168,&local_d8);
    std::__cxx11::string::_M_append((char *)&local_100,(ulong)local_168._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    value._M_str = (char *)local_100;
    value._M_len = local_f8;
    cmMakefile::AddDefinition
              (this,(local_e0->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + 1,value);
    cmsys::Directory::~Directory(&local_170);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    if (local_100 == &local_f0) goto LAB_003900a0;
    uVar12 = CONCAT71(local_f0._M_allocated_capacity._1_7_,local_f0._M_local_buf[0]);
    _Var13._M_p = (pointer)local_100;
  }
  else {
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    uVar12 = local_168.field_2._M_allocated_capacity;
    _Var13._M_p = local_168._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p == &local_168.field_2) goto LAB_003900a0;
  }
  operator_delete(_Var13._M_p,uVar12 + 1);
LAB_003900a0:
  return local_60 == 0x40;
}

Assistant:

bool cmAuxSourceDirectoryCommand(std::vector<std::string> const& args,
                                 cmExecutionStatus& status)
{
  if (args.size() != 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  std::string sourceListValue;
  std::string const& templateDirectory = args[0];
  std::string tdir;
  if (!cmSystemTools::FileIsFullPath(templateDirectory)) {
    tdir = cmStrCat(mf.GetCurrentSourceDirectory(), '/', templateDirectory);
  } else {
    tdir = templateDirectory;
  }

  // was the list already populated
  sourceListValue = mf.GetSafeDefinition(args[1]);

  std::vector<std::string> files;

  // Load all the files in the directory
  cmsys::Directory dir;
  if (dir.Load(tdir)) {
    size_t numfiles = dir.GetNumberOfFiles();
    for (size_t i = 0; i < numfiles; ++i) {
      std::string file = dir.GetFile(static_cast<unsigned long>(i));
      // Split the filename into base and extension
      std::string::size_type dotpos = file.rfind('.');
      if (dotpos != std::string::npos) {
        auto ext = cm::string_view(file).substr(dotpos + 1);
        // Process only source files
        auto* cm = mf.GetCMakeInstance();
        if (dotpos > 0 && cm->IsACLikeSourceExtension(ext)) {
          std::string fullname = cmStrCat(templateDirectory, '/', file);
          // add the file as a class file so
          // depends can be done
          cmSourceFile* sf = mf.GetOrCreateSource(fullname);
          sf->SetProperty("ABSTRACT", "0");
          files.push_back(std::move(fullname));
        }
      }
    }
  }
  std::sort(files.begin(), files.end());
  if (!sourceListValue.empty()) {
    sourceListValue += ";";
  }
  sourceListValue += cmList::to_string(files);
  mf.AddDefinition(args[1], sourceListValue);
  return true;
}